

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipTimer.h
# Opt level: O0

void __thiscall MipTimer::initialiseMipClocks(MipTimer *this,HighsTimerClock *mip_timer_clock)

{
  HighsInt HVar1;
  HighsInt HVar2;
  HighsInt HVar3;
  HighsInt HVar4;
  HighsInt HVar5;
  vector<int,_std::allocator<int>_> *this_00;
  reference pvVar6;
  long in_RSI;
  vector<int,_std::allocator<int>_> *clock;
  HighsTimer *timer_pointer;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  
  this_00 = (vector<int,_std::allocator<int>_> *)(in_RSI + 8);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0);
  *pvVar6 = 0;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,1);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,2);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,3);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x39);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x3a);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x3b);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,4);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,5);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,6);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,7);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,8);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,9);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,10);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x13);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x14);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x15);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x16);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x17);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x18);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x19);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x1a);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x1b);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x1c);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x1d);
  *pvVar6 = HVar1;
  HVar2 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (char *)CONCAT44(in_stack_ffffffffffffff4c,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x1e);
  *pvVar6 = HVar2;
  HVar3 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x1f);
  *pvVar6 = HVar3;
  HVar4 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_ffffffffffffff54,HVar3),
                     (char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x20);
  *pvVar6 = HVar4;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x21);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x22);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x23);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x24);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x25);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x35);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x36);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x37);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x38);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0xb);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0xc);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0xd);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0xe);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0xf);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x10);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x11);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x12);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x26);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x27);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x28);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x29);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x2a);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x2b);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x2c);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x2d);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x2e);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x2f);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x30);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x31);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x32);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x33);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x34);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x3c);
  *pvVar6 = HVar5;
  HVar1 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x3d);
  *pvVar6 = HVar1;
  return;
}

Assistant:

void initialiseMipClocks(HighsTimerClock& mip_timer_clock) {
    HighsTimer* timer_pointer = mip_timer_clock.timer_pointer_;
    std::vector<HighsInt>& clock = mip_timer_clock.clock_;
    clock.resize(kNumMipClock);
    clock[kMipClockTotal] = 0;
    clock[kMipClockPresolve] = timer_pointer->clock_def("MIP presolve");
    clock[kMipClockSolve] = timer_pointer->clock_def("MIP solve");
    clock[kMipClockPostsolve] = timer_pointer->clock_def("MIP postsolve");

    // Sometimes the analytic centre clock isn't stopped - because it
    // runs on a separate thread. Although it would be good to
    // understand this better, for now don't assert that this clock
    // has stopped in HighsTimer.h. This is done with a hard-coded
    // clock ID that needs to equal clock[kMipClockIpmSolveLp]
    //
    // Define the clocks for evaluating the LPs first, so that
    // clock[kMipClockIpmSolveLp] isn't changed by inserting new
    // clocks
    clock[kMipClockSimplexBasisSolveLp] =
        timer_pointer->clock_def("Solve LP - simplex basis");
    clock[kMipClockSimplexNoBasisSolveLp] =
        timer_pointer->clock_def("Solve LP - simplex no basis");
    clock[kMipClockIpmSolveLp] = timer_pointer->clock_def("Solve LP: IPM");
    assert(clock[kMipClockIpmSolveLp] == 9);

    // Level 1 - Should correspond to kMipClockTotal
    clock[kMipClockInit] = timer_pointer->clock_def("Initialise");
    clock[kMipClockRunPresolve] = timer_pointer->clock_def("Run presolve");
    clock[kMipClockRunSetup] = timer_pointer->clock_def("Run setup");
    clock[kMipClockTrivialHeuristics] =
        timer_pointer->clock_def("Trivial heuristics");
    clock[kMipClockEvaluateRootNode] =
        timer_pointer->clock_def("Evaluate root node");
    clock[kMipClockPerformAging0] = timer_pointer->clock_def("Perform aging 0");
    clock[kMipClockSearch] = timer_pointer->clock_def("Search");
    // kMipClockPostsolve

    // Evaluate root node
    clock[kMipClockStartSymmetryDetection] =
        timer_pointer->clock_def("Start symmetry detection");
    clock[kMipClockStartAnalyticCentreComputation] =
        timer_pointer->clock_def("A-centre - start");
    clock[kMipClockEvaluateRootLp] =
        timer_pointer->clock_def("Evaluate root LP");
    clock[kMipClockSeparateLpCuts] =
        timer_pointer->clock_def("Separate LP cuts");
    clock[kMipClockRandomizedRounding] =
        timer_pointer->clock_def("Randomized rounding");
    clock[kMipClockPerformRestart] =
        timer_pointer->clock_def("Perform restart");
    clock[kMipClockRootSeparation] =
        timer_pointer->clock_def("Root separation");
    clock[kMipClockFinishAnalyticCentreComputation] =
        timer_pointer->clock_def("A-centre - finish");
    clock[kMipClockRootCentralRounding] =
        timer_pointer->clock_def("Root central rounding");
    clock[kMipClockRootSeparationRound0] =
        timer_pointer->clock_def("Root separation round 0");
    clock[kMipClockRootHeuristicsReducedCost] =
        timer_pointer->clock_def("Root heuristics reduced cost");
    clock[kMipClockRootSeparationRound1] =
        timer_pointer->clock_def("Root separation round 1");
    clock[kMipClockRootHeuristicsRens] =
        timer_pointer->clock_def("Root heuristics RENS");
    clock[kMipClockRootSeparationRound2] =
        timer_pointer->clock_def("Root separation round 2");
    clock[kMipClockRootFeasibilityPump] =
        timer_pointer->clock_def("Root feasibility pump");
    clock[kMipClockRootSeparationRound3] =
        timer_pointer->clock_def("Root separation round 3");
    //    clock[kMipClock@] = timer_pointer->clock_def("@");

    clock[kMipClockEvaluateRootNode0] =
        timer_pointer->clock_def("kMipClockEvaluateRootNode0");
    clock[kMipClockEvaluateRootNode1] =
        timer_pointer->clock_def("kMipClockEvaluateRootNode1");
    clock[kMipClockEvaluateRootNode2] =
        timer_pointer->clock_def("kMipClockEvaluateRootNode2");

    // Separation
    clock[kMipClockRootSeparationRound] =
        timer_pointer->clock_def("Separation");
    clock[kMipClockRootSeparationFinishAnalyticCentreComputation] =
        timer_pointer->clock_def("A-centre - finish");
    clock[kMipClockRootSeparationCentralRounding] =
        timer_pointer->clock_def("Central rounding");
    clock[kMipClockRootSeparationEvaluateRootLp] =
        timer_pointer->clock_def("Evaluate root LP");

    // Presolve - Should correspond to kMipClockRunPresolve
    clock[kMipClockProbingPresolve] =
        timer_pointer->clock_def("Probing - presolve");

    // Search - Should correspond to kMipClockSearch
    clock[kMipClockPerformAging1] = timer_pointer->clock_def("Perform aging 1");
    clock[kMipClockDive] = timer_pointer->clock_def("Dive");
    clock[kMipClockOpenNodesToQueue0] =
        timer_pointer->clock_def("Open nodes to queue 0");
    clock[kMipClockDomainPropgate] =
        timer_pointer->clock_def("Domain propagate");
    clock[kMipClockPruneInfeasibleNodes] =
        timer_pointer->clock_def("Prune infeasible nodes");
    clock[kMipClockUpdateLocalDomain] =
        timer_pointer->clock_def("Update local domain");
    clock[kMipClockNodeSearch] = timer_pointer->clock_def("Node search");
    //    clock[kMipClock@] = timer_pointer->clock_def("@");

    // Dive - Should correspond to kMipClockDive
    clock[kMipClockDiveEvaluateNode] =
        timer_pointer->clock_def("Evaluate node");
    clock[kMipClockDivePrimalHeuristics] =
        timer_pointer->clock_def("Dive primal heuristics");
    clock[kMipClockTheDive] = timer_pointer->clock_def("The dive");
    clock[kMipClockBacktrackPlunge] =
        timer_pointer->clock_def("Backtrack plunge");
    clock[kMipClockPerformAging2] = timer_pointer->clock_def("Perform aging 2");

    // Primal heuristics - Should correspond to kMipDiveClockPrimalHeuristics
    clock[kMipClockDiveRandomizedRounding] =
        timer_pointer->clock_def("Dive Randomized rounding");
    clock[kMipClockDiveRens] = timer_pointer->clock_def("Dive RENS");
    clock[kMipClockDiveRins] = timer_pointer->clock_def("Dive RINS");

    // Node search
    clock[kMipClockCurrentNodeToQueue] =
        timer_pointer->clock_def("Current node to queue");
    clock[kMipClockSearchBacktrack] =
        timer_pointer->clock_def("Search backtrack");
    clock[kMipClockNodePrunedLoop] =
        timer_pointer->clock_def("Pruned loop search");
    clock[kMipClockOpenNodesToQueue1] =
        timer_pointer->clock_def("Open nodes to queue 1");
    clock[kMipClockEvaluateNode1] = timer_pointer->clock_def("Evaluate node 1");
    clock[kMipClockNodeSearchSeparation] =
        timer_pointer->clock_def("Node search separation");
    clock[kMipClockStoreBasis] = timer_pointer->clock_def("Store basis");
    //    clock[] = timer_pointer->clock_def("");

    // Sub-MIP clock
    clock[kMipClockSubMipSolve] = timer_pointer->clock_def("Sub-MIP solves");

    clock[kMipClockProbingImplications] =
        timer_pointer->clock_def("Probing - implications");
    //    clock[] = timer_pointer->clock_def("");
  }